

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

void __thiscall Cache::initCache(Cache *this)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  int **ppiVar4;
  int *piVar5;
  uint64_t **ppuVar6;
  uint64_t *puVar7;
  ulong uVar8;
  pointer pBVar9;
  uint uVar10;
  ulong __n;
  allocator_type local_69;
  undefined1 local_68 [16];
  pointer local_58;
  vector<Cache::Block,_std::allocator<Cache::Block>_> local_48;
  
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::vector
            (&local_48,(ulong)(this->policy).block_num,&local_69);
  local_68._0_8_ =
       (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68._8_8_ =
       (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_58 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)local_68);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector(&local_48);
  pBVar9 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar9) {
    uVar8 = 0;
    do {
      pBVar9[uVar8].size = (this->policy).block_size;
      pBVar9[uVar8].id = (uint32_t)(uVar8 / (this->policy).associativity);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,
                 (ulong)pBVar9[uVar8].size,(allocator_type *)&local_48);
      puVar2 = pBVar9[uVar8].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pBVar9[uVar8].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
      pBVar9[uVar8].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
      pBVar9[uVar8].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &local_58->valid;
      local_68 = ZEXT816(0) << 0x20;
      local_58 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      if ((pointer)local_68._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_68._0_8_);
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      pBVar9 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar9 >> 4) *
              -0x5555555555555555;
    } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
  }
  ppiVar4 = (int **)operator_new__(((ulong)(this->policy).block_num /
                                   (ulong)(this->policy).associativity) * 8);
  this->plru_bit = ppiVar4;
  uVar1 = (this->policy).block_num;
  uVar10 = (this->policy).associativity;
  uVar8 = (ulong)uVar1 / (ulong)uVar10;
  if (uVar10 <= uVar1) {
    uVar3 = 0;
    do {
      piVar5 = (int *)operator_new__((ulong)uVar10 << 2);
      this->plru_bit[uVar3] = piVar5;
      if ((this->policy).associativity != 0) {
        piVar5 = this->plru_bit[uVar3];
        uVar8 = 0;
        do {
          piVar5[uVar8] = 0;
          uVar8 = uVar8 + 1;
        } while (uVar8 < (this->policy).associativity);
      }
      uVar3 = uVar3 + 1;
      uVar10 = (this->policy).associativity;
      uVar8 = (ulong)(this->policy).block_num / (ulong)uVar10;
    } while (uVar3 < uVar8);
  }
  ppuVar6 = (uint64_t **)operator_new__(uVar8 * 8);
  this->mct = ppuVar6;
  if ((int)uVar8 != 0) {
    uVar1 = this->mct_size;
    __n = (ulong)uVar1 << 3;
    uVar3 = 0;
    do {
      puVar7 = (uint64_t *)operator_new__(__n);
      this->mct[uVar3] = puVar7;
      if (uVar1 != 0) {
        memset(this->mct[uVar3],0xff,__n);
      }
      uVar3 = uVar3 + 1;
    } while (uVar8 != uVar3);
  }
  return;
}

Assistant:

void Cache::initCache() {
    this->blocks = std::vector<Block>(policy.block_num);
    for (uint32_t i = 0; i < this->blocks.size(); i++) {
        Block &b = this->blocks[i];
        b.size = policy.block_size;
        b.id = i / policy.associativity;
        b.data = std::vector<uint8_t>(b.size);
    }
    this->plru_bit = new int *[this->policy.block_num / this->policy.associativity];
    for (uint32_t i = 0; i < this->policy.block_num / this->policy.associativity; i++) {
        this->plru_bit[i] = new int[this->policy.associativity];
        for (uint32_t j = 0; j < this->policy.associativity; j++) {
            this->plru_bit[i][j] = 0;
        }
    }
    this->mct = new uint64_t *[this->policy.block_num / this->policy.associativity];
    for (uint32_t i = 0; i < this->policy.block_num / this->policy.associativity; i++) {
        this->mct[i] = new uint64_t[this->mct_size];
        for (uint32_t j = 0; j < this->mct_size; j++) {
            this->mct[i][j] = (uint64_t) -1;
        }
    }

}